

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O0

void __thiscall ResolverThread::func(ResolverThread *this)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  *ptVar1;
  _Invoker_type this_00;
  bool bVar2;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  *p_Var3;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  *p_Var4;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  *ppEVar5;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  *__x;
  anon_class_56_2_cc9dbfaa local_188;
  BasicHandler local_150;
  char *err;
  undefined1 local_110 [8];
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  undefined1 local_f0 [8];
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  handler;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  loop;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  port;
  undefined1 local_98 [8];
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  name;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  request;
  ResolverThread *this_local;
  
  while (bVar2 = std::atomic::operator_cast_to_bool((atomic *)this), bVar2) {
    ptVar1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
              *)((long)&name.field_2 + 8);
    Liby::
    BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
    ::pop_wait(ptVar1,&this->requests_);
    p_Var3 = std::
             get<0ul,std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>
                       (ptVar1);
    std::__cxx11::string::string((string *)local_98,(string *)p_Var3);
    p_Var4 = std::
             get<1ul,std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                         *)((long)&name.field_2 + 8));
    std::__cxx11::string::string((string *)&loop,(string *)p_Var4);
    ptVar1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
              *)((long)&name.field_2 + 8);
    ppEVar5 = std::
              get<2ul,std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>
                        (ptVar1);
    handler._M_invoker = (_Invoker_type)*ppEVar5;
    __x = std::
          get<3ul,std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>
                    (ptVar1);
    std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
    function((function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)> *
             )local_f0,__x);
    bVar2 = std::function::operator_cast_to_bool((function *)local_f0);
    if (bVar2) {
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::list
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_110);
      Liby::Resolver::resolve
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&err,(string *)local_98,
                 (string *)&loop);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::operator=
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_110,
                 (list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&err);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::~list
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&err);
      this_00 = handler._M_invoker;
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::list
                (&local_188.eps,(list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_110);
      std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
      function(&local_188.handler,
               (function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                *)local_f0);
      std::function<void()>::function<ResolverThread::func()::__0,void>
                ((function<void()> *)&local_150,&local_188);
      Liby::EventLoop::runEventHandler((EventLoop *)this_00,&local_150);
      std::function<void_()>::~function(&local_150);
      func()::$_0::~__0((__0 *)&local_188);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::~list
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_110);
      eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node._M_size.
      _4_4_ = 0;
    }
    else {
      eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node._M_size.
      _4_4_ = 2;
    }
    std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
    ~function((function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
               *)local_f0);
    std::__cxx11::string::~string((string *)&loop);
    std::__cxx11::string::~string((string *)local_98);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
              *)((long)&name.field_2 + 8));
  }
  return;
}

Assistant:

void ResolverThread::func() {
    while (keep_running) {
        auto request = requests_.pop_wait();
        auto name = std::get<0>(request);
        auto port = std::get<1>(request);
        auto loop = std::get<2>(request);
        auto handler = std::get<3>(request);

        if (!handler) {
            continue;
        }

        std::list<Endpoint> eps;

        try {
            eps = Resolver::resolve(name, port);
        } catch (const char *err) { debug("resolver error: %s", err); }

        loop->runEventHandler([eps, handler] { handler(eps); });
    }
}